

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniquePtrVector.h
# Opt level: O2

void __thiscall
dg::vr::UniquePtrVector<dg::vr::VRLocation>::emplace_back<unsigned_long>
          (UniquePtrVector<dg::vr::VRLocation> *this,unsigned_long *args)

{
  VRLocation *this_00;
  VRLocation *local_20;
  
  this_00 = (VRLocation *)operator_new(0x140);
  VRLocation::VRLocation(this_00,(uint)*args);
  local_20 = this_00;
  std::
  vector<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>,std::allocator<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>>>
  ::emplace_back<dg::vr::VRLocation*>
            ((vector<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>,std::allocator<std::unique_ptr<dg::vr::VRLocation,std::default_delete<dg::vr::VRLocation>>>>
              *)this,&local_20);
  return;
}

Assistant:

void emplace_back(Args &&...args) {
        _v.emplace_back(new T(std::forward<Args>(args)...));
    }